

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit
          (PostResolutionChecks *this,QualifiedIdentifier *qi)

{
  CompileMessage local_a0;
  IdentifierPath local_68;
  
  AST::QualifiedIdentifier::getPath(&local_68,qi);
  Errors::unresolvedSymbol<soul::IdentifierPath>(&local_a0,&local_68);
  AST::Context::throwError
            (&(qi->super_Expression).super_Statement.super_ASTObject.context,&local_a0,false);
}

Assistant:

void visit (AST::QualifiedIdentifier& qi) override
        {
            super::visit (qi);
            qi.context.throwError (Errors::unresolvedSymbol (qi.getPath()));
        }